

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

ServiceDescriptorProto *
google::protobuf::descriptor_unittest::AddService(FileDescriptorProto *file,string *name)

{
  ServiceDescriptorProto *pSVar1;
  Arena *arena;
  
  pSVar1 = (ServiceDescriptorProto *)
           protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&(file->field_0)._impl_.service_.super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<google::protobuf::ServiceDescriptorProto>);
  *(byte *)&pSVar1->field_0 = *(byte *)&pSVar1->field_0 | 1;
  arena = (Arena *)(pSVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set<>(&(pSVar1->field_0)._impl_.name_,name,arena);
  return pSVar1;
}

Assistant:

ServiceDescriptorProto* AddService(FileDescriptorProto* file,
                                   const std::string& name) {
  ServiceDescriptorProto* result = file->add_service();
  result->set_name(name);
  return result;
}